

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FluctuatingChargeNVT.cpp
# Opt level: O2

RealType __thiscall OpenMD::FluctuatingChargeNVT::calcConservedQuantity(FluctuatingChargeNVT *this)

{
  RealType RVar1;
  double dVar2;
  undefined1 auVar3 [16];
  pair<double,_double> pVar4;
  
  RVar1 = 0.0;
  if ((this->super_FluctuatingChargePropagator).hasFlucQ_ == true) {
    pVar4 = Snapshot::getElectronicThermostat(this->snap);
    dVar2 = (double)((this->super_FluctuatingChargePropagator).info_)->nGlobalFluctuatingCharges_ *
            8.31451e-07 * this->targetTemp_;
    auVar3._0_8_ = dVar2 * pVar4.second;
    auVar3._8_8_ = this->tauThermostat_ * dVar2 * this->tauThermostat_ * pVar4.first * pVar4.first;
    auVar3 = divpd(auVar3,_DAT_00241ec0);
    RVar1 = auVar3._8_8_ + auVar3._0_8_;
  }
  return RVar1;
}

Assistant:

RealType FluctuatingChargeNVT::calcConservedQuantity() {
    if (!hasFlucQ_) return 0.0;
    pair<RealType, RealType> thermostat = snap->getElectronicThermostat();
    RealType chi                        = thermostat.first;
    RealType integralOfChidt            = thermostat.second;
    RealType fkBT =
        info_->getNFluctuatingCharges() * Constants::kB * targetTemp_;

    RealType thermostat_kinetic = fkBT * tauThermostat_ * tauThermostat_ * chi *
                                  chi / (2.0 * Constants::energyConvert);

    RealType thermostat_potential =
        fkBT * integralOfChidt / Constants::energyConvert;

    return thermostat_kinetic + thermostat_potential;
  }